

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::String&,char_const(&)[3],long,char_const(&)[6]>
          (String *__return_storage_ptr__,kj *this,String *params,char (*params_1) [3],
          long *params_2,char (*params_3) [6])

{
  long lVar1;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  long local_68;
  long local_60;
  CappedArray<char,_26UL> local_58;
  
  lVar1 = *(long *)(this + 8);
  local_68 = lVar1;
  if (lVar1 != 0) {
    local_68 = *(long *)this;
  }
  local_60 = 0;
  if (lVar1 != 0) {
    local_60 = lVar1 + -1;
  }
  local_78 = toCharSequence<char_const(&)[3]>((char (*) [3])params);
  toCharSequence<long>(&local_58,(long *)params_1);
  local_88 = toCharSequence<char_const(&)[6]>((char (*) [6])params_2);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_68,&local_78,(ArrayPtr<const_char> *)&local_58,
             (CappedArray<char,_26UL> *)&local_88,(ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}